

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O2

error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
pstore::romfs::romfs::dir_to_string_abi_cxx11_
          (error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,romfs *this,not_null<const_pstore::romfs::directory_*> dir)

{
  not_null<const_pstore::romfs::directory_*> dir_00;
  iterator iVar1;
  iterator iVar2;
  not_null<const_pstore::romfs::directory_*> *pnVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int line;
  char *str;
  error_code eVar5;
  error_code erc;
  error_code erc_00;
  long local_88;
  long local_80;
  undefined1 local_68 [24];
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  if ((this->root_).ptr_ == dir.ptr_) {
    error_or<std::__cxx11::string>::error_or<char_const(&)[2],void>
              ((error_or<std::__cxx11::string> *)__return_storage_ptr__,(char (*) [2])0x13a8f5);
  }
  else {
    iVar1 = directory::find<3ul>(dir.ptr_,(char (*) [3])"..");
    iVar2 = directory::end(dir.ptr_);
    if (iVar1.pos_ == iVar2.pos_) {
      assert_failed("parent_de != dir->end () && \"All directories must contain a \'..\' entry\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                    ,0x168);
    }
    dirent::opendir((dirent *)local_68,(char *)iVar1.pos_);
    if (local_68[0x10] == false) {
      pnVar3 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
               value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                         ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                          local_68);
      dir_00.ptr_ = pnVar3->ptr_;
      dir_to_string_abi_cxx11_(&local_50,this,dir_00);
      if (local_50.has_error_ == false) {
        pbVar4 = error_or<std::__cxx11::string>::
                 value_storage_impl<pstore::error_or<std::__cxx11::string>&,std::__cxx11::string>
                           (&local_50);
        std::__cxx11::string::string((string *)&local_88,(string *)pbVar4);
        if (local_80 == 0) {
          line = 0x16c;
          str = "s.length () > 0";
LAB_0012eb91:
          assert_failed(str,
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                        ,line);
        }
        if (*(char *)(local_88 + -1 + local_80) != '/') {
          std::__cxx11::string::push_back((char)&local_88);
        }
        iVar1 = directory::find(dir_00.ptr_,dir);
        iVar2 = directory::end(dir.ptr_);
        if (iVar1.pos_ == iVar2.pos_) {
          line = 0x172;
          str = "p != dir->end ()";
          goto LAB_0012eb91;
        }
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::append((char *)&local_88);
        error_or<std::__cxx11::string>::error_or<std::__cxx11::string&,void>
                  ((error_or<std::__cxx11::string> *)__return_storage_ptr__,pbVar4);
        std::__cxx11::string::~string((string *)&local_88);
      }
      else {
        eVar5 = error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::get_error(&local_50);
        erc_00._M_cat = eVar5._M_cat;
        erc_00._4_4_ = 0;
        erc_00._M_value = eVar5._M_value;
        error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        error_or(__return_storage_ptr__,erc_00);
      }
      error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~error_or(&local_50);
    }
    else {
      eVar5 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get_error
                        ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                         local_68);
      erc._M_cat = eVar5._M_cat;
      erc._4_4_ = 0;
      erc._M_value = eVar5._M_value;
      error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      error_or(__return_storage_ptr__,erc);
    }
    error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::~error_or
              ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

error_or<std::string> romfs::dir_to_string (not_null<directory const *> const dir) const {
            if (dir == root_) {
                return error_or<std::string>{"/"};
            }
            auto const parent_de = dir->find ("..");
            PSTORE_ASSERT (parent_de != dir->end () && "All directories must contain a '..' entry");
            return parent_de->opendir () >>=
                   [this, dir] (not_null<directory const *> const parent) {
                       return this->dir_to_string (parent) >>= [dir, parent] (std::string s) {
                           PSTORE_ASSERT (s.length () > 0);
                           if (s.back () != '/') {
                               s += '/';
                           }

                           auto const p = parent->find (dir);
                           PSTORE_ASSERT (p != dir->end ());
                           return error_or<std::string> (s.append (p->name ().get ()));
                       };
                   };
        }